

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureGatherCubeCase::createInstance
          (TextureGatherCubeCase *this,Context *context)

{
  GatherType gatherType;
  OffsetSize OVar1;
  int iVar2;
  GatherCubeArgs *__cur;
  VkPhysicalDeviceProperties *pVVar3;
  TextureGatherInstance *this_00;
  Context *pCVar4;
  undefined1 *puVar5;
  IVec2 *pIVar6;
  pointer pGVar7;
  TextureFormat *ctx;
  IVec2 *pIVar8;
  undefined1 *puVar9;
  long lVar10;
  int i;
  long lVar11;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  iterations;
  TextureFormat local_48;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  local_40;
  
  ctx = &local_48;
  gatherType = (this->m_baseParams).gatherType;
  OVar1 = (this->m_baseParams).offsetSize;
  pVVar3 = Context::getDeviceProperties(context);
  if (OVar1 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    local_48.order = (pVVar3->limits).minTexelGatherOffset;
    local_48.type = (pVVar3->limits).maxTexelGatherOffset;
  }
  else if (OVar1 == OFFSETSIZE_MINIMUM_REQUIRED) {
    local_48.order = ~RGB;
    local_48.type = UNORM_BYTE_44;
  }
  else if (OVar1 == OFFSETSIZE_NONE) {
    local_48.order = R;
    local_48.type = SNORM_INT8;
  }
  else {
    local_48.order = ~R;
    local_48.type = ~SNORM_INT8;
  }
  generateCubeCaseIterations
            (&local_40,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)&local_48);
  this_00 = (TextureGatherInstance *)operator_new(1000);
  iVar2 = this->m_textureSize;
  TextureGatherInstance::TextureGatherInstance(this_00,context,&this->m_baseParams);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TextureGatherCubeInstance_00d5c7e8;
  *(int *)&this_00->field_0x264 = iVar2;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)0x0;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
  this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
  this_00[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
  pCVar4 = (Context *)
           std::
           _Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
           ::_M_allocate((_Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                          *)(((long)local_40.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_40.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333),(size_t)context);
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)pCVar4;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = pCVar4;
  *(long *)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode =
       ((long)local_40.
              super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_40.
             super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
             ._M_impl.super__Vector_impl_data._M_start) + (long)pCVar4;
  if (local_40.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_40.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar5 = (undefined1 *)((long)&pCVar4->m_testCtx + 4);
    pIVar6 = ((local_40.
               super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
               ._M_impl.super__Vector_impl_data._M_start)->gatherArgs).offsets;
    pGVar7 = local_40.
             super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      *(int *)&pCVar4->m_testCtx = (pGVar7->gatherArgs).componentNdx;
      lVar10 = 0;
      pIVar8 = pIVar6;
      puVar9 = puVar5;
      do {
        lVar11 = 0;
        do {
          *(int *)(puVar9 + lVar11 * 4) = pIVar8->m_data[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 == 1);
        lVar10 = lVar10 + 1;
        puVar9 = puVar9 + 8;
        pIVar8 = pIVar8 + 1;
      } while (lVar10 != 4);
      *(CubeFace *)
       &(pCVar4->m_device).
        super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data.
        field_0xc = pGVar7->face;
      pGVar7 = pGVar7 + 1;
      pCVar4 = (Context *)&pCVar4->m_allocator;
      puVar5 = puVar5 + 0x28;
      pIVar6 = pIVar6 + 5;
    } while (pGVar7 != local_40.
                       super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = pCVar4;
  local_48.order = CHANNELORDER_LAST;
  local_48.type = CHANNELTYPE_LAST;
  tcu::TextureCube::TextureCube
            ((TextureCube *)&this_00[1].super_ShaderRenderCaseInstance.m_sparseContext,&local_48,1);
  TextureGatherInstance::init(this_00,(EVP_PKEY_CTX *)ctx);
  if (local_40.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureGatherCubeCase::createInstance (Context& context) const
{
	const vector<GatherCubeArgs>	iterations	= generateCubeCaseIterations(m_baseParams.gatherType,
																			 m_baseParams.textureFormat,
																			 getOffsetRange(m_baseParams.offsetSize, context.getDeviceProperties().limits));

	return new TextureGatherCubeInstance(context, m_baseParams, m_textureSize, iterations);
}